

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O0

bool from_issue_342::test_uintwide_t_spot_values_from_issue_342_pos(void)

{
  wide_integer *pwVar1;
  uintwide_t<128U,_unsigned_int,_void,_false> *puVar2;
  enable_if_t<((_false)_&&_(_false)),_int> *in_R8;
  undefined1 local_90 [7];
  bool result_divmod_is_ok;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>_>
  r_pp_1;
  local_uint128_t b_1;
  local_uint128_t a_1;
  bool result_pp_is_ok;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>_>
  r_pp;
  local_uint128_t b;
  local_uint128_t a;
  bool result_is_ok;
  
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)
             (b.values.super_array<unsigned_int,_4UL>.elems + 2),0xb,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)
             (r_pp.second.values.super_array<unsigned_int,_4UL>.elems + 2),3,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  pwVar1 = (wide_integer *)
           math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_false> *)
                      (b.values.super_array<unsigned_int,_4UL>.elems + 2));
  puVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_false> *)
                      (r_pp.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,false,false>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>_>
              *)(a_1.values.super_array<unsigned_int,_4UL>.elems + 3),pwVar1,puVar2,
             (uintwide_t<128U,_unsigned_int,_void,_false> *)0x0,in_R8);
  a_1.values.super_array<unsigned_int,_4UL>.elems[2]._3_1_ = 1;
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)
             (b_1.values.super_array<unsigned_int,_4UL>.elems + 2),0xc,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)
             (r_pp_1.second.values.super_array<unsigned_int,_4UL>.elems + 2),3,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  pwVar1 = (wide_integer *)
           math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_false> *)
                      (b_1.values.super_array<unsigned_int,_4UL>.elems + 2));
  puVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_false> *)
                      (r_pp_1.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,false,false>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>_>
              *)local_90,pwVar1,puVar2,(uintwide_t<128U,_unsigned_int,_void,_false> *)0x0,in_R8);
  return true;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_342_pos() -> bool
  {
    // See also: https://github.com/ckormanyos/wide-integer/issues/342

    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint128_t;
    #else
    using local_uint128_t = ::math::wide_integer::uint128_t;
    #endif

    auto result_is_ok = true;

    {
      const local_uint128_t a = 11;
      const local_uint128_t b =  3;

      const auto r_pp = divmod(+a, +b);

      const auto result_pp_is_ok = ((r_pp.first == +3) && (r_pp.second == +2));

      result_is_ok = (result_pp_is_ok && result_is_ok);
    }

    {
      const local_uint128_t a = 12;
      const local_uint128_t b =  3;

      const auto r_pp = divmod(+a, +b);

      const auto result_divmod_is_ok = ((r_pp.first == +4) && (r_pp.second == 0));

      result_is_ok = (result_divmod_is_ok && result_is_ok);
    }

    return result_is_ok;
  }